

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

int16_t __thiscall wasm::Random::get16(Random *this)

{
  int8_t iVar1;
  int8_t iVar2;
  int temp;
  Random *this_local;
  
  iVar1 = get(this);
  iVar2 = get(this);
  return (short)iVar1 << 8 | (short)iVar2;
}

Assistant:

int16_t Random::get16() {
  auto temp = uint16_t(get()) << 8;
  return temp | uint16_t(get());
}